

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

monst * revive(obj *obj)

{
  obj *obj_00;
  bool bVar1;
  boolean bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  monst *pmVar6;
  char *pcVar7;
  monst *pmVar8;
  char cVar9;
  schar sVar10;
  char cVar11;
  char local_42;
  char local_41;
  int holder;
  int montype;
  int container_nesting;
  int local_34;
  
  container_nesting = 0;
  if (obj->otyp != 0x10e) {
    return (monst *)0x0;
  }
  montype = obj->corpsenm;
  if (obj->where == '\x02') {
    holder = 0;
    obj_00 = (obj->v).v_nexthere;
    pmVar6 = get_container_location(obj_00,&holder,&container_nesting);
    if (holder == 1) {
      bVar2 = get_obj_location(obj,&local_41,&local_42,1);
      if (bVar2 == '\0') {
        return (monst *)0x0;
      }
    }
    else {
      local_42 = u.uy;
      local_41 = u.ux;
      if (holder != 3) {
        if (holder != 4) {
          return (monst *)0x0;
        }
        local_41 = pmVar6->mx;
        local_42 = pmVar6->my;
      }
    }
    cVar9 = local_41;
    cVar11 = local_42;
    if (local_42 == '\0' || local_41 == '\0') {
      return (monst *)0x0;
    }
    if ((obj_00->field_0x4b & 0x20) != 0) {
      return (monst *)0x0;
    }
    if (2 < container_nesting) {
      return (monst *)0x0;
    }
    if (obj_00->otyp == 0x215) {
      return (monst *)0x0;
    }
    if ((obj_00->otyp == 0xe0) && (uVar4 = mt_random(), uVar4 % 0x28 != 0)) {
      return (monst *)0x0;
    }
  }
  else {
    bVar2 = get_obj_location(obj,&local_41,&local_42,0);
    cVar9 = local_41;
    cVar11 = local_42;
    if (bVar2 == '\0') {
      return (monst *)0x0;
    }
  }
  pmVar6 = level->monsters[cVar9][cVar11];
  if (((pmVar6 != (monst *)0x0) && ((pmVar6->field_0x61 & 2) == 0)) &&
     (bVar2 = enexto((coord *)&holder,level,cVar9,cVar11,mons + montype), bVar2 != '\0')) {
    local_41 = (char)holder;
    local_42 = holder._1_1_;
    cVar9 = (char)holder;
    cVar11 = holder._1_1_;
  }
  bVar2 = cant_create(&montype,'\x01');
  if (bVar2 != '\0') {
    pmVar6 = makemon(mons + montype,level,(int)cVar9,(int)cVar11,3);
    if (pmVar6 == (monst *)0x0) {
      return (monst *)0x0;
    }
    pmVar6->mhp = 100;
    pmVar6->mhpmax = 100;
    bVar1 = false;
    mon_adjust_speed(pmVar6,2,(obj *)0x0);
    sVar10 = '\0';
    goto LAB_0027b979;
  }
  if ((obj->oxlth == 0) || ((*(uint *)&obj->field_0x4a & 0x600000) != 0x200000)) {
    pmVar6 = makemon(mons + montype,level,(int)cVar9,(int)cVar11,0x43);
  }
  else {
    holder._0_2_ = CONCAT11(cVar11,cVar9);
    pmVar6 = montraits(obj,(coord *)&holder);
    if (((pmVar6 != (monst *)0x0) && (pmVar6->mtame != '\0')) && ((pmVar6->field_0x63 & 4) == 0)) {
      wary_dog(pmVar6,'\x01');
    }
  }
  if (pmVar6 == (monst *)0x0) {
    return (monst *)0x0;
  }
  if ((obj->oxlth == 0) || ((*(uint *)&obj->field_0x4a & 0x600000) != 0x400000)) {
    bVar1 = false;
    sVar10 = '\0';
  }
  else {
    pmVar8 = find_mid(level,obj->oextra[0],1);
    if ((pmVar8 == (monst *)0x0) || (pmVar8->data != mons + 0x12a)) {
      bVar1 = false;
      sVar10 = '\0';
    }
    else {
      cVar11 = pmVar8->mx;
      local_34 = (int)pmVar8->my;
      sVar10 = pmVar8->mtame;
      if (pmVar8->wormno == '\0') {
        bVar3 = viz_array[local_34][(int)cVar11] & 2;
      }
      else {
        bVar3 = worm_known(level,pmVar8);
      }
      if (bVar3 != 0) {
        uVar4 = *(uint *)&pmVar8->field_0x60;
        if ((((uVar4 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar4 & 0x280) == 0) goto LAB_0027b8fa;
        }
        else if (((uVar4 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0027b8fa:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar7 = Monnam(pmVar8);
            pline("%s is suddenly drawn into its former body!",pcVar7);
          }
        }
      }
      mondead(pmVar8);
      newsym((int)cVar11,local_34);
      bVar1 = true;
    }
    obj->field_0x4c = obj->field_0x4c & 0x9f;
  }
  if (obj->onamelth != '\0') {
    pmVar6 = christen_monst(pmVar6,(char *)((long)obj->oextra + (long)obj->oxlth));
  }
  if ((pmVar6->data->msound == '\x1f') || (pmVar6->m_id == quest_status.leader_m_id)) {
    quest_status._2_1_ = quest_status._2_1_ & 0xef;
  }
LAB_0027b979:
  if (obj->oeaten != 0) {
    iVar5 = eaten_stat(pmVar6->mhp,obj);
    pmVar6->mhp = iVar5;
  }
  pmVar6->field_0x61 = pmVar6->field_0x61 | 0x40;
  if (bVar1) {
    if ((sVar10 != '\0') && (pmVar8 = tamedog(pmVar6,(obj *)0x0), pmVar8 != (monst *)0x0)) {
      pmVar8->mtame = sVar10;
      pmVar6 = pmVar8;
    }
    pmVar6->field_0x62 = pmVar6->field_0x62 | 0x20;
  }
  switch(obj->where) {
  case '\x01':
    break;
  case '\x02':
    obj_extract_self(obj);
    obfree(obj,(obj *)0x0);
    return pmVar6;
  case '\x03':
    useup(obj);
    return pmVar6;
  case '\x04':
    m_useup((obj->v).v_ocarry,obj);
    return pmVar6;
  default:
    panic("revive");
  }
  cVar11 = obj->ox;
  cVar9 = obj->oy;
  if (1 < obj->quan) {
    obj = splitobj(obj,1);
  }
  delobj(obj);
  newsym((int)cVar11,(int)cVar9);
  return pmVar6;
}

Assistant:

struct monst *revive(struct obj *obj)
{
	struct monst *mtmp = NULL;
	struct obj *container = NULL;
	int container_nesting = 0;
	schar savetame = 0;
	boolean recorporealization = FALSE;
	boolean in_container = FALSE;
	if (obj->otyp == CORPSE) {
		int montype = obj->corpsenm;
		xchar x, y;

		if (obj->where == OBJ_CONTAINED) {
			/* deal with corpses in [possibly nested] containers */
			struct monst *carrier;
			int holder = 0;

			container = obj->ocontainer;
			carrier = get_container_location(container, &holder,
							&container_nesting);
			switch(holder) {
			    case OBJ_MINVENT:
				x = carrier->mx; y = carrier->my;
				in_container = TRUE;
				break;
			    case OBJ_INVENT:
				x = u.ux; y = u.uy;
				in_container = TRUE;
				break;
			    case OBJ_FLOOR:
				if (!get_obj_location(obj, &x, &y, CONTAINED_TOO))
					return NULL;
				in_container = TRUE;
				break;
			    default:
			    	return NULL;
			}
		} else {
			/* only for invent, minvent, or floor */
			if (!get_obj_location(obj, &x, &y, 0))
			    return NULL;
		}
		if (in_container) {
			/* Rules for revival from containers:
			   - the container cannot be locked
			   - the container cannot be heavily nested (>2 is arbitrary)
			   - the container cannot be a statue or bag of holding
			     (except in very rare cases for the latter)
			 */
			if (!x || !y || container->olocked || container_nesting > 2 ||
			    container->otyp == STATUE ||
			    (container->otyp == BAG_OF_HOLDING && rn2(40)))
				return NULL;
		}

		if (MON_AT(level, x,y)) {
		    coord new_xy;

		    if (enexto(&new_xy, level, x, y, &mons[montype]))
			x = new_xy.x,  y = new_xy.y;
		}

		if (cant_create(&montype, TRUE)) {
			/* make a zombie or worm instead */
			mtmp = makemon(&mons[montype], level, x, y,
				       NO_MINVENT|MM_NOWAIT);
			if (mtmp) {
				mtmp->mhp = mtmp->mhpmax = 100;
				mon_adjust_speed(mtmp, 2, NULL); /* MFAST */
			}
		} else {
		    if (obj->oxlth && (obj->oattached == OATTACHED_MONST)) {
			    coord xy;
			    xy.x = x; xy.y = y;
			    mtmp = montraits(obj, &xy);
			    if (mtmp && mtmp->mtame && !mtmp->isminion)
				wary_dog(mtmp, TRUE);
		    } else
			    mtmp = makemon(&mons[montype], level, x, y,
				    NO_MINVENT|MM_NOWAIT|MM_NOCOUNTBIRTH);
		    if (mtmp) {
			if (obj->oxlth && (obj->oattached == OATTACHED_M_ID)) {
			    unsigned m_id;
			    struct monst *ghost;
			    memcpy(&m_id, obj->oextra, sizeof(m_id));
			    ghost = find_mid(level, m_id, FM_FMON);
			    if (ghost && ghost->data == &mons[PM_GHOST]) {
				    int x2, y2;
				    x2 = ghost->mx; y2 = ghost->my;
				    if (ghost->mtame)
					savetame = ghost->mtame;
				    if (canseemon(level, ghost))
					pline("%s is suddenly drawn into its former body!",
						Monnam(ghost));
				    mondead(ghost);
				    recorporealization = TRUE;
				    newsym(x2, y2);
			    }
			    /* don't mess with obj->oxlth here */
			    obj->oattached = OATTACHED_NOTHING;
			}
			/* Monster retains its name */
			if (obj->onamelth)
			    mtmp = christen_monst(mtmp, ONAME(obj));
			/* flag the quest leader as alive. */
			if (mtmp->data->msound == MS_LEADER || mtmp->m_id ==
				quest_status.leader_m_id)
			    quest_status.leader_is_dead = FALSE;
		    }
		}
		if (mtmp) {
			if (obj->oeaten)
				mtmp->mhp = eaten_stat(mtmp->mhp, obj);
			/* track that this monster was revived at least once */
			mtmp->mrevived = 1;

			if (recorporealization) {
				/* If mtmp is revivification of former tame ghost*/
				if (savetame) {
				    struct monst *mtmp2 = tamedog(mtmp, NULL);
				    if (mtmp2) {
					mtmp2->mtame = savetame;
					mtmp = mtmp2;
				    }
				}
				/* was ghost, now alive, it's all very confusing */
				mtmp->mconf = 1;
			}

			switch (obj->where) {
			    case OBJ_INVENT:
				useup(obj);
				break;
			    case OBJ_FLOOR:
				/* in case MON_AT+enexto for invisible mon */
				x = obj->ox,  y = obj->oy;
				/* not useupf(), which charges */
				if (obj->quan > 1L)
				    obj = splitobj(obj, 1L);
				delobj(obj);
				newsym(x, y);
				break;
			    case OBJ_MINVENT:
				m_useup(obj->ocarry, obj);
				break;
			    case OBJ_CONTAINED:
				obj_extract_self(obj);
				obfree(obj, NULL);
				break;
			    default:
				panic("revive");
			}
		}
	}
	return mtmp;
}